

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

void Rml::Shutdown(void)

{
  code *pcVar1;
  bool bVar2;
  CoreData *pCVar3;
  
  if (((initialised & 1) == 0) &&
     (bVar2 = Assert("Rml::Shutdown() called, but RmlUi is not initialised!",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Core.cpp"
                     ,0xbc), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pCVar3->contexts);
  PluginRegistry::NotifyShutdown();
  Factory::Shutdown();
  TemplateCache::Shutdown();
  StyleSheetFactory::Shutdown();
  StyleSheetParser::Shutdown();
  StyleSheetSpecification::Shutdown();
  (**(code **)(*font_interface + 0x18))();
  pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  itlib::
  flat_map<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
  ::clear(&pCVar3->render_managers);
  Detail::ShutdownObserverPtrPool();
  initialised = 0;
  text_input_handler = 0;
  font_interface = (long *)0x0;
  render_interface = 0;
  file_interface = 0;
  system_interface = 0;
  ControlledLifetimeResource<Rml::CoreData>::Shutdown
            ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  EventSpecificationInterface::Shutdown();
  ShutdownComputeProperty();
  ReleaseMemoryPools();
  return;
}

Assistant:

void Shutdown()
{
	RMLUI_ASSERTMSG(initialised, "Rml::Shutdown() called, but RmlUi is not initialised!");

	// Clear out all contexts, which should also clean up all attached elements.
	core_data->contexts.clear();

	// Notify all plugins we're being shutdown.
	PluginRegistry::NotifyShutdown();

	Factory::Shutdown();
	TemplateCache::Shutdown();
	StyleSheetFactory::Shutdown();
	StyleSheetParser::Shutdown();
	StyleSheetSpecification::Shutdown();

	font_interface->Shutdown();

	core_data->render_managers.clear();

	Detail::ShutdownObserverPtrPool();

	initialised = false;

	text_input_handler = nullptr;
	font_interface = nullptr;
	render_interface = nullptr;
	file_interface = nullptr;
	system_interface = nullptr;

	core_data.Shutdown();

	EventSpecificationInterface::Shutdown();

	ShutdownComputeProperty();
	ReleaseMemoryPools();
}